

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O1

int ReadLine(char *buffer,size_t size,_func_int *ReadFunction)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  bVar4 = false;
  lVar3 = 0;
  while (iVar1 = (*ReadFunction)(), iVar1 != -1) {
    if ((char)iVar1 == '\r') {
LAB_0010896e:
      iVar1 = 0;
    }
    else if ((char)iVar1 == '\n') {
      bVar4 = true;
      goto LAB_0010896e;
    }
    buffer[lVar3] = (char)iVar1;
    lVar2 = lVar3 + 1;
    if ((size - 1 == lVar3) || (lVar3 = lVar2, bVar4)) goto LAB_00108997;
  }
  buffer[lVar3] = '\0';
  lVar2 = lVar3;
LAB_00108997:
  buffer[lVar2] = '\0';
  return (int)lVar2;
}

Assistant:

int ReadLine(char* buffer, size_t size, int (*ReadFunction)())
{
    int i;
    char c;
    bool done = false;
    int bytesProcessed = 0;

    while (!done)
    {
        i = ReadFunction();
        if (i == -1)
        {
            *buffer = 0;
            break;
        }
        c = (char)i;
        bytesProcessed++;
        switch (c)
        {
        case '\r': *buffer++ = 0; break;
        case '\n':
            *buffer++ = 0;
            done = true;
            break;
        default: *buffer++ = c; break;
        }

        if (bytesProcessed == size)
        {
            break;
        }
    }

    *buffer = 0;
    return bytesProcessed;
}